

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int resolve_pseudo_var(JSContext *ctx,JSFunctionDef *s,JSAtom var_name)

{
  int iVar1;
  int in_EDX;
  JSFunctionDef *in_RSI;
  JSFunctionDef *in_RDI;
  int var_idx;
  int local_20;
  JSAtom name;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI->has_this_binding == 0) {
    local_20 = -1;
  }
  else if (in_EDX == 8) {
    if (in_RSI->this_var_idx < 0) {
      iVar1 = add_var_this((JSContext *)in_RDI,in_RSI);
      in_RSI->this_var_idx = iVar1;
    }
    local_20 = in_RSI->this_var_idx;
  }
  else {
    name = (JSAtom)((ulong)in_RSI >> 0x20);
    if (in_EDX == 0x71) {
      if (in_RSI->new_target_var_idx < 0) {
        iVar1 = add_var((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI,name);
        in_RSI->new_target_var_idx = iVar1;
      }
      local_20 = in_RSI->new_target_var_idx;
    }
    else if (in_EDX == 0x72) {
      if (in_RSI->this_active_func_var_idx < 0) {
        iVar1 = add_var((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI,name);
        in_RSI->this_active_func_var_idx = iVar1;
      }
      local_20 = in_RSI->this_active_func_var_idx;
    }
    else if (in_EDX == 0x73) {
      if (in_RSI->home_object_var_idx < 0) {
        iVar1 = add_var((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI,name);
        in_RSI->home_object_var_idx = iVar1;
      }
      local_20 = in_RSI->home_object_var_idx;
    }
    else {
      local_20 = -1;
    }
  }
  return local_20;
}

Assistant:

static int resolve_pseudo_var(JSContext *ctx, JSFunctionDef *s,
                               JSAtom var_name)
{
    int var_idx;

    if (!s->has_this_binding)
        return -1;
    switch(var_name) {
    case JS_ATOM_home_object:
        /* 'home_object' pseudo variable */
        if (s->home_object_var_idx < 0)
            s->home_object_var_idx = add_var(ctx, s, var_name);
        var_idx = s->home_object_var_idx;
        break;
    case JS_ATOM_this_active_func:
        /* 'this.active_func' pseudo variable */
        if (s->this_active_func_var_idx < 0)
            s->this_active_func_var_idx = add_var(ctx, s, var_name);
        var_idx = s->this_active_func_var_idx;
        break;
    case JS_ATOM_new_target:
        /* 'new.target' pseudo variable */
        if (s->new_target_var_idx < 0)
            s->new_target_var_idx = add_var(ctx, s, var_name);
        var_idx = s->new_target_var_idx;
        break;
    case JS_ATOM_this:
        /* 'this' pseudo variable */
        if (s->this_var_idx < 0)
            s->this_var_idx = add_var_this(ctx, s);
        var_idx = s->this_var_idx;
        break;
    default:
        var_idx = -1;
        break;
    }
    return var_idx;
}